

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O0

CutResult QtPrivate::QContainerImplHelper::mid
                    (qsizetype originalLength,qsizetype *_position,qsizetype *_length)

{
  qsizetype *length;
  qsizetype *position;
  qsizetype *_length_local;
  qsizetype *_position_local;
  qsizetype originalLength_local;
  CutResult local_4;
  
  if (originalLength < *_position) {
    *_position = 0;
    *_length = 0;
    return Null;
  }
  if (*_position < 0) {
    if ((*_length < 0) || (originalLength <= *_length + *_position)) {
      *_position = 0;
      *_length = originalLength;
      return Full;
    }
    if (*_length + *_position < 1) {
      *_length = 0;
      *_position = 0;
      return Null;
    }
    *_length = *_position + *_length;
    *_position = 0;
  }
  else if ((ulong)(originalLength - *_position) < (ulong)*_length) {
    *_length = originalLength - *_position;
  }
  if ((*_position == 0) && (*_length == originalLength)) {
    local_4 = Full;
  }
  else {
    local_4 = Empty;
    if (0 < *_length) {
      local_4 = Subset;
    }
  }
  return local_4;
}

Assistant:

static constexpr CutResult mid(qsizetype originalLength, qsizetype *_position, qsizetype *_length)
    {
        qsizetype &position = *_position;
        qsizetype &length = *_length;
        if (position > originalLength) {
            position = 0;
            length = 0;
            return Null;
        }

        if (position < 0) {
            if (length < 0 || length + position >= originalLength) {
                position = 0;
                length = originalLength;
                return Full;
            }
            if (length + position <= 0) {
                position = length = 0;
                return Null;
            }
            length += position;
            position = 0;
        } else if (size_t(length) > size_t(originalLength - position)) {
            length = originalLength - position;
        }

        if (position == 0 && length == originalLength)
            return Full;

        return length > 0 ? Subset : Empty;
    }